

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::CoverageMaskInvertCase::iterate(CoverageMaskInvertCase *this)

{
  int iVar1;
  GLenum GVar2;
  deBool dVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  TestContext *this_01;
  char *local_d68;
  MessageBuilder local_c98;
  RGBA local_b18;
  byte local_b12;
  allocator<char> local_b11;
  undefined1 local_b10 [6];
  bool passed;
  allocator<char> local_ae9;
  string local_ae8;
  LogImage local_ac8;
  MessageBuilder local_a38;
  MessageBuilder local_8b8;
  MessageBuilder local_738;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  LogImage local_568;
  MessageBuilder local_4d8;
  MessageBuilder local_358;
  MessageBuilder local_1d8;
  undefined1 local_48 [8];
  Surface renderedImgSampleCoverage;
  Surface renderedImgNoSampleCoverage;
  TestLog *log;
  CoverageMaskInvertCase *this_local;
  
  this_00 = tcu::TestContext::getLog
                      ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  iVar1 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface((Surface *)&renderedImgSampleCoverage.m_pixels.m_cap,iVar1,iVar1);
  iVar1 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface((Surface *)local_48,iVar1,iVar1);
  MultisampleCase::randomizeViewport(&this->super_MultisampleCase);
  do {
    glwEnable(0xbe2);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glEnable(GL_BLEND)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x62b);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    glwBlendEquation(0x8006);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glBlendEquation(GL_FUNC_ADD)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x62c);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    glwBlendFunc(1,1);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glBlendFunc(GL_ONE, GL_ONE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x62d);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::TestLog::operator<<(&local_1d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_1d8,
                      (char (*) [79])
                      "Additive blending enabled in order to detect (erroneously) overlapping samples"
                     );
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d8);
  tcu::TestLog::operator<<(&local_358,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_358,(char (*) [28])"Clearing color to all-zeros");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_358);
  do {
    glwClearColor(0.0,0.0,0.0,0.0);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glClearColor(0.0f, 0.0f, 0.0f, 0.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x631);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    glwClear(0x4000);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glClear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x632);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::TestLog::operator<<(&local_4d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_4d8,
                      (char (*) [53])"Drawing the pattern with GL_SAMPLE_COVERAGE disabled");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4d8);
  drawPattern(this,false);
  MultisampleCase::readImage
            (&this->super_MultisampleCase,(Surface *)&renderedImgSampleCoverage.m_pixels.m_cap);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"RenderedImageNoSampleCoverage",&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b0,"Rendered image with GL_SAMPLE_COVERAGE disabled",&local_5b1);
  tcu::LogImage::LogImage
            (&local_568,&local_588,&local_5b0,(Surface *)&renderedImgSampleCoverage.m_pixels.m_cap,
             QP_IMAGE_COMPRESSION_MODE_PNG);
  tcu::TestLog::operator<<(this_00,&local_568);
  tcu::LogImage::~LogImage(&local_568);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator(&local_5b1);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator(&local_589);
  tcu::TestLog::operator<<(&local_738,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_738,(char (*) [28])"Clearing color to all-zeros");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_738);
  do {
    glwClear(0x4000);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glClear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x63a);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    glwEnable(0x80a0);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glEnable(GL_SAMPLE_COVERAGE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x63b);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::TestLog::operator<<(&local_8b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_8b8,
                      (char (*) [78])
                      "Drawing the pattern with GL_SAMPLE_COVERAGE enabled, using non-inverted masks"
                     );
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_8b8);
  drawPattern(this,false);
  tcu::TestLog::operator<<(&local_a38,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_a38,
                      (char (*) [106])
                      "Drawing the pattern with GL_SAMPLE_COVERAGE enabled, using same sample coverage values but inverted masks"
                     );
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_a38);
  drawPattern(this,true);
  MultisampleCase::readImage(&this->super_MultisampleCase,(Surface *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ae8,"RenderedImageSampleCoverage",&local_ae9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b10,"Rendered image with GL_SAMPLE_COVERAGE enabled",&local_b11);
  tcu::LogImage::LogImage
            (&local_ac8,&local_ae8,(string *)local_b10,(Surface *)local_48,
             QP_IMAGE_COMPRESSION_MODE_PNG);
  tcu::TestLog::operator<<(this_00,&local_ac8);
  tcu::LogImage::~LogImage(&local_ac8);
  std::__cxx11::string::~string((string *)local_b10);
  std::allocator<char>::~allocator(&local_b11);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::allocator<char>::~allocator(&local_ae9);
  tcu::RGBA::RGBA(&local_b18,0);
  local_b12 = tcu::pixelThresholdCompare
                        (this_00,"CoverageVsNoCoverage",
                         "Comparison of same pattern with GL_SAMPLE_COVERAGE disabled and enabled",
                         (Surface *)&renderedImgSampleCoverage.m_pixels.m_cap,(Surface *)local_48,
                         &local_b18,COMPARE_LOG_ON_ERROR);
  if ((bool)local_b12) {
    tcu::TestLog::operator<<(&local_c98,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_c98,(char (*) [47])"Success: The two images rendered are identical");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_c98);
  }
  this_01 = Context::getTestContext((this->super_MultisampleCase).super_TestCase.m_context);
  if ((local_b12 & 1) == 0) {
    local_d68 = "Failed";
  }
  else {
    local_d68 = "Passed";
  }
  tcu::TestContext::setTestResult(this_01,(uint)((local_b12 & 1) == 0),local_d68);
  tcu::Surface::~Surface((Surface *)local_48);
  tcu::Surface::~Surface((Surface *)&renderedImgSampleCoverage.m_pixels.m_cap);
  return STOP;
}

Assistant:

CoverageMaskInvertCase::IterateResult CoverageMaskInvertCase::iterate (void)
{
	TestLog&		log								= m_testCtx.getLog();
	tcu::Surface	renderedImgNoSampleCoverage		(m_viewportSize, m_viewportSize);
	tcu::Surface	renderedImgSampleCoverage		(m_viewportSize, m_viewportSize);

	randomizeViewport();

	GLU_CHECK_CALL(glEnable(GL_BLEND));
	GLU_CHECK_CALL(glBlendEquation(GL_FUNC_ADD));
	GLU_CHECK_CALL(glBlendFunc(GL_ONE, GL_ONE));
	log << TestLog::Message << "Additive blending enabled in order to detect (erroneously) overlapping samples" << TestLog::EndMessage;

	log << TestLog::Message << "Clearing color to all-zeros" << TestLog::EndMessage;
	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 0.0f));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
	log << TestLog::Message << "Drawing the pattern with GL_SAMPLE_COVERAGE disabled" << TestLog::EndMessage;
	drawPattern(false);
	readImage(renderedImgNoSampleCoverage);

	log << TestLog::Image("RenderedImageNoSampleCoverage", "Rendered image with GL_SAMPLE_COVERAGE disabled", renderedImgNoSampleCoverage, QP_IMAGE_COMPRESSION_MODE_PNG);

	log << TestLog::Message << "Clearing color to all-zeros" << TestLog::EndMessage;
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
	GLU_CHECK_CALL(glEnable(GL_SAMPLE_COVERAGE));
	log << TestLog::Message << "Drawing the pattern with GL_SAMPLE_COVERAGE enabled, using non-inverted masks" << TestLog::EndMessage;
	drawPattern(false);
	log << TestLog::Message << "Drawing the pattern with GL_SAMPLE_COVERAGE enabled, using same sample coverage values but inverted masks" << TestLog::EndMessage;
	drawPattern(true);
	readImage(renderedImgSampleCoverage);

	log << TestLog::Image("RenderedImageSampleCoverage", "Rendered image with GL_SAMPLE_COVERAGE enabled", renderedImgSampleCoverage, QP_IMAGE_COMPRESSION_MODE_PNG);

	bool passed = tcu::pixelThresholdCompare(log,
											 "CoverageVsNoCoverage",
											 "Comparison of same pattern with GL_SAMPLE_COVERAGE disabled and enabled",
											 renderedImgNoSampleCoverage,
											 renderedImgSampleCoverage,
											 tcu::RGBA(0),
											 tcu::COMPARE_LOG_ON_ERROR);

	if (passed)
		log << TestLog::Message << "Success: The two images rendered are identical" << TestLog::EndMessage;

	m_context.getTestContext().setTestResult(passed ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
											 passed ? "Passed"				: "Failed");

	return STOP;
}